

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

int __thiscall hwnet::util::TimerMgr::remove(TimerMgr *this,char *__filename)

{
  value_type pTVar1;
  Timer *e;
  lock_guard<std::mutex> lVar2;
  element_type *peVar3;
  size_t __n;
  reference ppTVar4;
  element_type *peVar5;
  undefined8 extraout_RAX;
  value_type tail;
  size_t offsetIdx;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> guard;
  Ptr *e_local;
  TimerMgr *this_local;
  
  guard._M_device = (mutex_type *)__filename;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mtx);
  peVar3 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)guard._M_device);
  if (this == peVar3->mMgr) {
    peVar3 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)guard._M_device);
    if (peVar3->mIndex != 0) {
      peVar3 = std::
               __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)guard._M_device);
      if (peVar3->mIndex <= this->elements_size) {
        peVar3 = std::
                 __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)guard._M_device);
        __n = getOffset(this,peVar3->mIndex);
        ppTVar4 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::
                  operator[](&this->elements,__n);
        pTVar1 = *ppTVar4;
        peVar5 = std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)
                            guard._M_device);
        if (pTVar1 == peVar5) {
          ppTVar4 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::
                    operator[](&this->elements,this->elements_size - 1);
          e = *ppTVar4;
          peVar5 = std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)
                              guard._M_device);
          if (e == peVar5) {
            this->elements_size = this->elements_size - 1;
          }
          else {
            peVar3 = std::
                     __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)guard._M_device);
            swap(this,peVar3->mIndex,e->mIndex);
            this->elements_size = this->elements_size - 1;
            change(this,e);
          }
          ppTVar4 = std::vector<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>::
                    operator[](&this->elements,this->elements_size);
          *ppTVar4 = (value_type)0x0;
          peVar3 = std::
                   __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)guard._M_device);
          peVar3->mIndex = 0;
          peVar3 = std::
                   __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)guard._M_device);
          std::function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)>::operator=
                    (&peVar3->mCallback,(nullptr_t)0x0);
          lVar2 = guard;
          peVar3 = std::
                   __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)guard._M_device);
          std::shared_ptr<hwnet::util::Timer>::operator=
                    (&peVar3->selfPtr,(shared_ptr<hwnet::util::Timer> *)lVar2._M_device);
          this_local._7_1_ = 1;
        }
        else {
          this_local._7_1_ = 0;
        }
        goto LAB_00160499;
      }
    }
    this_local._7_1_ = 0;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00160499:
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool remove(Timer::Ptr &e) {
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this == e->mMgr) {
			if(e->mIndex == 0 || e->mIndex > this->elements_size) {
				return false;
			}

			auto offsetIdx = getOffset(e->mIndex);
			if(this->elements[offsetIdx] != e.get()) {
				return false;
			}

			auto tail = this->elements[this->elements_size-1];
			
			if(tail == e.get()) {
				this->elements_size--;
			} else {
				this->swap(e->mIndex,tail->mIndex);
				this->elements_size--;
				this->change(tail);
			}

			this->elements[this->elements_size] = nullptr;
			e->mIndex = 0;
			e->mCallback = nullptr;
			e->selfPtr = e;
			return true;
		} else {
			return false;
		} 
	}